

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

Publication * __thiscall
helics::ValueFederateManager::getPublication(ValueFederateManager *this,int index)

{
  bool bVar1;
  undefined4 in_ESI;
  handle pubHandle;
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffa8;
  DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *this_00;
  int in_stack_ffffffffffffffe8;
  undefined1 *local_8;
  
  this_00 = (DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
             *)&stack0xffffffffffffffd0;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock((shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
          *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator*((lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
               *)this_00);
  bVar1 = isValidIndex<int,gmlc::containers::DualStringMappedVector<helics::Publication,helics::InterfaceHandle,(reference_stability)0,5>>
                    ((int)((ulong)this_00 >> 0x20),in_stack_ffffffffffffffa8);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::operator*((lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                 *)&stack0xffffffffffffffd0);
    local_8 = (undefined1 *)
              gmlc::containers::
              DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
              ::operator[](this_00,(size_t)in_stack_ffffffffffffffa8);
  }
  else {
    local_8 = invalidPubNC;
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
                  *)0x2a421e);
  return (Publication *)local_8;
}

Assistant:

Publication& ValueFederateManager::getPublication(int index)
{
    auto pubHandle = publications.lock();
    if (isValidIndex(index, *pubHandle)) {
        return (*pubHandle)[index];
    }
    return invalidPubNC;
}